

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O2

stop_bits stop_bits_from_text(string *s)

{
  bool bVar1;
  type tVar2;
  
  bVar1 = std::operator==(s,"1");
  tVar2 = one;
  if (!bVar1) {
    bVar1 = std::operator==(s,"1.5");
    if (bVar1) {
      tVar2 = onepointfive;
    }
    else {
      bVar1 = std::operator==(s,"2");
      if (!bVar1) {
        __assert_fail("s == \"2\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                      ,0x8e,
                      "boost::asio::serial_port_base::stop_bits stop_bits_from_text(const std::string &)"
                     );
      }
      tVar2 = two;
    }
  }
  return (stop_bits)tVar2;
}

Assistant:

static boost::asio::serial_port_base::stop_bits stop_bits_from_text( const std::string& s )
{
    if ( s == "1" )
    {
        return boost::asio::serial_port_base::stop_bits(
            boost::asio::serial_port_base::stop_bits::one );
    }
    else if ( s == "1.5" )
    {
        return boost::asio::serial_port_base::stop_bits(
            boost::asio::serial_port_base::stop_bits::onepointfive );
    }

    assert( s == "2" );

    return boost::asio::serial_port_base::stop_bits(
        boost::asio::serial_port_base::stop_bits::two );
}